

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_descriptor_heap_introspection_ssbo(Impl *this)

{
  int iVar1;
  Id IVar2;
  Id IVar3;
  Builder *pBVar4;
  LoggingCallback p_Var5;
  void *pvVar6;
  Builder *this_00;
  uint value;
  byte bVar7;
  VulkanSRVBinding vulkan_binding;
  D3DBinding d3d_binding;
  char buffer [4096];
  Vector<spv::Id> local_1028;
  undefined5 uStack_1010;
  undefined3 uStack_100b;
  char local_1008 [4064];
  
  get_remapping_stage(this->execution_model);
  iVar1 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[2])();
  if ((char)iVar1 != '\0') {
    if ((this->options).physical_address_descriptor_stride != 0) {
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      IVar2 = spv::Builder::makeIntegerType(pBVar4,0x20,false);
      value = (this->options).physical_address_descriptor_stride;
      if ((this->options).instruction_instrumentation.enabled == true) {
        pBVar4 = SPIRVModule::get_builder(this->spirv_module);
        IVar2 = spv::Builder::makeVectorType(pBVar4,IVar2,2);
      }
      else {
        value = value * 2;
      }
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      this_00 = SPIRVModule::get_builder(this->spirv_module);
      IVar3 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this_00,IVar3,value,false);
      IVar2 = spv::Builder::makeArrayType(pBVar4,IVar2,IVar3,0);
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration
                (pBVar4,IVar2,DecorationArrayStride,
                 (uint)(this->options).instruction_instrumentation.enabled * 4 + 4);
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ =
           SUB85(local_1028.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1,0);
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ =
           (undefined3)
           ((ulong)(local_1028.
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1) >> 0x28);
      *local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = IVar2;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_5_ =
           local_1028.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_5_;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._5_3_ =
           local_1028.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_3_;
      IVar2 = get_struct_type(this,&local_1028,0,"DescriptorHeapRawPayload");
      if (local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_1028.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberDecoration(pBVar4,IVar2,0,DecorationOffset,0);
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      IVar2 = spv::Builder::makeRuntimeArray(pBVar4,IVar2);
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration
                (pBVar4,IVar2,DecorationArrayStride,
                 (this->options).physical_address_descriptor_stride << 3);
      bVar7 = (this->options).instruction_instrumentation.type == BufferSynchronizationValidation &
              (this->options).instruction_instrumentation.enabled;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ =
           SUB85(local_1028.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1,0);
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ =
           (undefined3)
           ((ulong)(local_1028.
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1) >> 0x28);
      *local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = IVar2;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_5_ =
           local_1028.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_5_;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._5_3_ =
           local_1028.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._5_3_;
      IVar2 = get_struct_type(this,&local_1028,0,"DescriptorHeapRobustnessSSBO");
      if (local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_1028.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar4,IVar2,DecorationBlock,-1);
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberDecoration(pBVar4,IVar2,0,DecorationOffset,0);
      if (bVar7 == 0) {
        pBVar4 = SPIRVModule::get_builder(this->spirv_module);
        spv::Builder::addMemberDecoration(pBVar4,IVar2,0,DecorationNonWritable,-1);
        pBVar4 = SPIRVModule::get_builder(this->spirv_module);
        spv::Builder::addMemberDecoration(pBVar4,IVar2,0,DecorationNonReadable,-1);
      }
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberName(pBVar4,IVar2,0,"descriptors");
      IVar2 = SPIRVModule::create_variable
                        (this->spirv_module,StorageClassStorageBuffer,IVar2,
                         "DescriptorHeapRobustness");
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar4,IVar2,DecorationDescriptorSet,0);
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar4,IVar2,DecorationBinding,0);
      (this->instrumentation).descriptor_heap_introspection_var_id = IVar2;
      if (bVar7 == 0) {
        return true;
      }
      pBVar4 = SPIRVModule::get_builder(this->spirv_module);
      IVar2 = spv::Builder::makeIntegerType(pBVar4,0x20,false);
      IVar2 = SPIRVModule::create_variable
                        (this->spirv_module,StorageClassPrivate,IVar2,"InvocationID");
      (this->instrumentation).invocation_id_var_id = IVar2;
      return true;
    }
    p_Var5 = get_thread_log_callback();
    if (p_Var5 == (LoggingCallback)0x0) {
      emit_descriptor_heap_introspection_ssbo();
    }
    else {
      builtin_strncpy(local_1008,"de must be set.\n",0x11);
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0x637365645f;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0x706972;
      uStack_1010 = 0x735f726f74;
      uStack_100b = 0x697274;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x6c61636973796870;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0x726464615f;
      local_1028.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0x737365;
      pvVar6 = get_thread_log_callback_userdata();
      (*p_Var5)(pvVar6,Error,(char *)&local_1028);
    }
  }
  return false;
}

Assistant:

bool Converter::Impl::emit_descriptor_heap_introspection_ssbo()
{
	// We need to know the size of the descriptor heap. Rather than passing this
	// through a separate descriptor, we can just query the SSBO size of the
	// side-band SSBO. It is designed to have a size equal to the descriptor heap.
	// Somewhat hacky is that we can ask for a global heap of RTAS, which gets us this descriptor.
	D3DBinding d3d_binding = {
		get_remapping_stage(execution_model), DXIL::ResourceKind::RTAccelerationStructure, 0,
		UINT32_MAX, UINT32_MAX, UINT32_MAX, 0,
	};
	VulkanSRVBinding vulkan_binding = {};

	if (!resource_mapping_iface->remap_srv(d3d_binding, vulkan_binding))
		return false;

	if (vulkan_binding.buffer_binding.descriptor_type != VulkanDescriptorType::SSBO &&
	    vulkan_binding.buffer_binding.descriptor_type != VulkanDescriptorType::Identity)
	{
		LOGE("Dummy SSBO must be an SSBO.\n");
		return false;
	}

	if (options.physical_address_descriptor_stride == 0)
	{
		LOGE("physical_address_descriptor_stride must be set.\n");
		return false;
	}

	spv::Id u32_type = builder().makeUintType(32);
	uint32_t elems = options.physical_address_descriptor_stride;

	if (options.instruction_instrumentation.enabled)
		u32_type = builder().makeVectorType(u32_type, 2);
	else
		elems *= 2;

	spv::Id u32_array_type = builder().makeArrayType(u32_type, builder().makeUintConstant(elems), 0);
	builder().addDecoration(u32_array_type, spv::DecorationArrayStride,
	                        options.instruction_instrumentation.enabled ? 8 : 4);

	spv::Id inner_struct_type = get_struct_type({ u32_array_type }, 0, "DescriptorHeapRawPayload");
	builder().addMemberDecoration(inner_struct_type, 0, spv::DecorationOffset, 0);

	spv::Id inner_struct_array_type = builder().makeRuntimeArray(inner_struct_type);
	builder().addDecoration(inner_struct_array_type, spv::DecorationArrayStride,
	                        8u * options.physical_address_descriptor_stride);

	bool sync_val =
		options.instruction_instrumentation.enabled &&
		options.instruction_instrumentation.type == InstructionInstrumentationType::BufferSynchronizationValidation;

	spv::Id block_type_id = get_struct_type({ inner_struct_array_type }, 0, "DescriptorHeapRobustnessSSBO");
	builder().addDecoration(block_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(block_type_id, 0, spv::DecorationOffset, 0);
	if (!sync_val)
	{
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonWritable);
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonReadable);
	}
	builder().addMemberName(block_type_id, 0, "descriptors");
	spv::Id var_id = create_variable(spv::StorageClassStorageBuffer, block_type_id, "DescriptorHeapRobustness");

	builder().addDecoration(var_id, spv::DecorationDescriptorSet, vulkan_binding.buffer_binding.descriptor_set);
	builder().addDecoration(var_id, spv::DecorationBinding, vulkan_binding.buffer_binding.binding);

	// Take OpArrayLength of this variable's first member and we have it.
	instrumentation.descriptor_heap_introspection_var_id = var_id;

	if (sync_val)
	{
		instrumentation.invocation_id_var_id =
			create_variable(spv::StorageClassPrivate, builder().makeUintType(32), "InvocationID");
	}

	return true;
}